

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O1

Clause * __thiscall
Inferences::resolveClausesHelper
          (Inferences *this,InductionContext *context,Stack<Kernel::Clause_*> *cls,
          ElementIterator eIt,Substitution *subst,bool generalized,bool applySubst,
          Substitution *indLitSubst)

{
  int iVar1;
  Unit *pUVar2;
  undefined8 *puVar3;
  bool bVar4;
  undefined8 *puVar5;
  bool bVar6;
  Self SVar7;
  uint uVar8;
  UnitList *pUVar9;
  long lVar10;
  UnitList *pUVar11;
  Unit *pUVar12;
  Literal *pLVar13;
  Literal *pLVar14;
  Clause *pCVar15;
  char cVar16;
  uint uVar17;
  int res_1;
  Substitution *applicator;
  int res;
  undefined8 *puVar18;
  undefined8 *puVar19;
  Inferences *pIVar20;
  undefined7 in_stack_00000011;
  TermReplacement tr;
  RStack<Literal_*> resLits;
  Inference inf;
  RobSubstitution renaming;
  ulong local_210;
  Literal *local_200;
  undefined1 local_1e8 [56];
  Inferences *local_1b0;
  Substitution *local_1a8;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_1a0;
  _Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
  local_190;
  Inference local_160;
  RobSubstitution local_130;
  Inference local_68;
  
  local_1a8 = (Substitution *)eIt._data;
  Kernel::RobSubstitution::RobSubstitution(&local_130);
  iVar1 = *(int *)(eIt._0_8_ + (long)(int)cls * 4);
  pUVar2 = (Unit *)(context->_indTerms).
                   super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                   super__Vector_impl_data._M_finish[(int)cls];
  pUVar9 = (UnitList *)
           ::Lib::FixedSizeAllocator<16UL>::alloc
                     ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  pUVar9->_head = pUVar2;
  pUVar9->_tail = (List<Kernel::Unit_*> *)0x0;
  while (iVar1 != -1) {
    lVar10 = (long)iVar1;
    iVar1 = *(int *)(eIt._0_8_ + lVar10 * 4);
    pUVar12 = (Unit *)(context->_indTerms).
                      super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                      super__Vector_impl_data._M_finish[lVar10];
    pUVar11 = (UnitList *)
              ::Lib::FixedSizeAllocator<16UL>::alloc
                        ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    pUVar11->_head = pUVar12;
    pUVar11->_tail = pUVar9;
    pUVar9 = pUVar11;
  }
  for (puVar18 = *(undefined8 **)(this + 0x28); puVar18 != (undefined8 *)0x0;
      puVar18 = (undefined8 *)*puVar18) {
    pUVar12 = (Unit *)puVar18[1];
    pUVar11 = (UnitList *)
              ::Lib::FixedSizeAllocator<16UL>::alloc
                        ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    pUVar11->_head = pUVar12;
    pUVar11->_tail = pUVar9;
    pUVar9 = pUVar11;
  }
  applicator = (Substitution *)CONCAT71(in_stack_00000011,applySubst);
  local_200._0_1_ = (char)subst;
  cVar16 = 'G';
  if ((char)local_200 == '\0') {
    cVar16 = (applicator != (Substitution *)0x0) * '\x02' + 'F';
  }
  local_1e8._1_7_ = (undefined7)((ulong)local_1e8._0_8_ >> 8);
  local_1e8[0] = cVar16;
  local_1e8._8_8_ = pUVar9;
  Kernel::Inference::Inference(&local_160,(GeneratingInferenceMany *)local_1e8);
  ::Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled(&local_1a0);
  local_1b0 = this + 0x28;
  uVar8 = pUVar2[1]._number & 0xfffff;
  if (uVar8 != 0) {
    pUVar12 = pUVar2 + 1 + 1;
    uVar17 = (uint)(uVar8 != 0);
    do {
      local_200 = *(Literal **)pUVar12;
      pLVar13 = Kernel::Literal::complementaryLiteral(local_200);
      pLVar13 = Kernel::SubstHelper::apply<Kernel::Substitution>(pLVar13,local_1a8);
      bVar6 = false;
      bVar4 = false;
      pIVar20 = local_1b0;
      do {
        pIVar20 = *(Inferences **)pIVar20;
        if (pIVar20 == (Inferences *)0x0) break;
        puVar18 = *(undefined8 **)(pIVar20 + 0x20);
        puVar3 = *(undefined8 **)(pIVar20 + 0x18);
        do {
          if (puVar3 == puVar18) goto LAB_004f052c;
          pLVar14 = (Literal *)*puVar3;
          if ((Substitution *)CONCAT71(in_stack_00000011,applySubst) != (Substitution *)0x0) {
            pLVar14 = Kernel::SubstHelper::apply<Kernel::Substitution>
                                (pLVar14,(Substitution *)CONCAT71(in_stack_00000011,applySubst));
          }
          puVar3 = puVar3 + 1;
          bVar4 = bVar6;
        } while (pLVar14 != pLVar13);
        bVar4 = true;
        bVar6 = bVar4;
LAB_004f052c:
      } while (!bVar4);
      applicator = (Substitution *)CONCAT71(in_stack_00000011,applySubst);
      if (!bVar4) {
        if (generalized) {
          getContextReplacementMap
                    ((map<Kernel::Term_*,_Kernel::TermList,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                      *)&local_190,(InductionContext *)this,true);
          local_1e8._0_8_ = &PTR_transform_00b65220;
          std::
          _Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
          ::_Rb_tree((_Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                      *)(local_1e8 + 8),&local_190);
          std::
          _Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
          ::~_Rb_tree(&local_190);
          pLVar13 = Kernel::SubstHelper::apply<Kernel::Substitution>(local_200,local_1a8);
          local_200 = Kernel::TermTransformerCommon::transformLiteral
                                ((TermTransformerCommon *)local_1e8,pLVar13);
          local_1e8._0_8_ = &PTR_transform_00b65220;
          std::
          _Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
          ::~_Rb_tree((_Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                       *)(local_1e8 + 8));
        }
        SVar7._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
             local_1a0._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
             .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl;
        pLVar13 = Kernel::RobSubstitution::apply(&local_130,local_200,0);
        if (*(Literal ***)
             ((long)SVar7._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
             0x10) == *(Literal ***)
                       ((long)SVar7._M_t.
                              super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                              .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                              _M_head_impl + 0x18)) {
          ::Lib::Stack<Kernel::Literal_*>::expand
                    ((Stack<Kernel::Literal_*> *)
                     SVar7._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
        }
        **(Literal ***)
          ((long)SVar7._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10)
             = pLVar13;
        *(Literal ***)
         ((long)SVar7._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10)
             = *(Literal ***)
                ((long)SVar7._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
                0x10) + 1;
      }
      pUVar12 = (Unit *)(&(pUVar2 + 1)[1]._number + (long)(int)uVar17 * 2);
      bVar4 = uVar17 < uVar8;
      uVar17 = (uVar17 < uVar8) + uVar17;
    } while (bVar4);
  }
  puVar18 = *(undefined8 **)local_1b0;
  do {
    if (puVar18 == (undefined8 *)0x0) {
      local_68._0_8_ = local_160._0_8_;
      local_68._8_4_ = local_160._8_4_;
      local_68._age = local_160._age;
      local_68._splits = local_160._splits;
      local_68._ptr1 = local_160._ptr1;
      local_68._ptr2 = local_160._ptr2;
      local_68.th_ancestors = local_160.th_ancestors;
      local_68.all_ancestors = local_160.all_ancestors;
      pCVar15 = Kernel::Clause::fromStack
                          ((Stack<Kernel::Literal_*> *)
                           local_1a0._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                           .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                           _M_head_impl,&local_68);
      ::Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      ~Recycled(&local_1a0);
      Kernel::RobSubstitution::~RobSubstitution(&local_130);
      return pCVar15;
    }
    if ((*(uint *)(puVar18[1] + 0x38) & 0xfffff) != 0) {
      local_210 = 0;
      do {
        puVar3 = (undefined8 *)puVar18[4];
        if ((undefined8 *)puVar18[3] == puVar3) {
LAB_004f070e:
          pLVar13 = *(Literal **)(puVar18[1] + 0x70 + local_210 * 8);
          if (applicator != (Substitution *)0x0) {
            pLVar13 = Kernel::SubstHelper::apply<Kernel::Substitution>(pLVar13,applicator);
            getContextReplacementMap
                      ((map<Kernel::Term_*,_Kernel::TermList,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                        *)&local_190,(InductionContext *)this,true);
            local_1e8._0_8_ = &PTR_transform_00b65220;
            std::
            _Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
            ::_Rb_tree((_Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                        *)(local_1e8 + 8),&local_190);
            std::
            _Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
            ::~_Rb_tree(&local_190);
            pLVar13 = Kernel::TermTransformerCommon::transformLiteral
                                ((TermTransformerCommon *)local_1e8,pLVar13);
            local_1e8._0_8_ = &PTR_transform_00b65220;
            std::
            _Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
            ::~_Rb_tree((_Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                         *)(local_1e8 + 8));
          }
          SVar7._M_t.
          super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
          .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
               (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                  )local_1a0._self;
          pLVar13 = Kernel::RobSubstitution::apply(&local_130,pLVar13,1);
          if (*(Literal ***)
               ((long)SVar7._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
               0x10) == *(Literal ***)
                         ((long)SVar7._M_t.
                                super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                _M_head_impl + 0x18)) {
            ::Lib::Stack<Kernel::Literal_*>::expand
                      ((Stack<Kernel::Literal_*> *)
                       SVar7._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
          }
          **(Literal ***)
            ((long)SVar7._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
            0x10) = pLVar13;
          *(Literal ***)
           ((long)SVar7._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10
           ) = *(Literal ***)
                ((long)SVar7._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
                0x10) + 1;
        }
        else {
          bVar4 = true;
          puVar5 = (undefined8 *)puVar18[3];
          do {
            puVar19 = puVar5 + 1;
            getContextReplacementMap
                      ((map<Kernel::Term_*,_Kernel::TermList,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                        *)&local_190,(InductionContext *)this,true);
            local_1e8._0_8_ = &PTR_transform_00b65220;
            std::
            _Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
            ::_Rb_tree((_Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                        *)(local_1e8 + 8),&local_190);
            std::
            _Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
            ::~_Rb_tree(&local_190);
            pLVar14 = Kernel::TermTransformerCommon::transformLiteral
                                ((TermTransformerCommon *)local_1e8,(Literal *)*puVar5);
            pLVar13 = *(Literal **)(puVar18[1] + 0x70 + local_210 * 8);
            local_1e8._0_8_ = &PTR_transform_00b65220;
            std::
            _Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
            ::~_Rb_tree((_Rb_tree<Kernel::Term_*,_std::pair<Kernel::Term_*const,_Kernel::TermList>,_std::_Select1st<std::pair<Kernel::Term_*const,_Kernel::TermList>_>,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                         *)(local_1e8 + 8));
            if (pLVar14 == pLVar13) {
              bVar4 = false;
              break;
            }
            puVar5 = puVar19;
          } while (puVar19 != puVar3);
          applicator = (Substitution *)CONCAT71(in_stack_00000011,applySubst);
          if (bVar4) goto LAB_004f070e;
        }
        local_210 = local_210 + 1;
      } while (local_210 < ((uint)*(undefined8 *)(puVar18[1] + 0x38) & 0xfffff));
    }
    puVar18 = (undefined8 *)*puVar18;
  } while( true );
}

Assistant:

Clause* resolveClausesHelper(const InductionContext& context, const Stack<Clause*>& cls, IntUnionFind::ElementIterator eIt, Substitution& subst, bool generalized, bool applySubst, Substitution* indLitSubst)
{
  // first create the clause with the required size
  RobSubstitution renaming;
  ASS(eIt.hasNext());
  auto cl = cls[eIt.next()];
  auto premises = UnitList::singleton(cl);
  const auto& toResolve = context._cls;
  while (eIt.hasNext()) {
    auto other = cls[eIt.next()];
    UnitList::push(other,premises);
  }

  for (const auto& kv : toResolve) {
    UnitList::push(kv.first, premises);
  }

  Inference inf(GeneratingInferenceMany(
    generalized ? InferenceRule::GEN_INDUCTION_HYPERRESOLUTION
                : ( indLitSubst ? InferenceRule::FREE_VAR_INDUCTION_HYPERRESOLUTION : InferenceRule::INDUCTION_HYPERRESOLUTION),
    premises));
  RStack<Literal*> resLits;

  for (Literal* curr : cl->iterLits()) {
    auto clit = SubstHelper::apply<Substitution>(Literal::complementaryLiteral(curr), subst);
    bool contains = false;
    for (const auto& kv : toResolve) {
      for (const auto& lit : kv.second) {
        Literal* slit = indLitSubst ? SubstHelper::apply<Substitution>(lit, *indLitSubst) : lit;
        if (slit == clit) {
          contains = true;
          break;
        }
      }
      if (contains) {
        break;
      }
    }
    if (!contains) {
      Literal* resLit;
      if (applySubst) {
        TermReplacement tr(getContextReplacementMap(context, /*inverse=*/true));
        resLit = tr.transformLiteral(SubstHelper::apply<Substitution>(curr,subst));
      } else {
        resLit = curr;
      }
      resLits->push(renaming.apply(resLit,0));
    }
  }

  for (const auto& kv : toResolve) {
    for (unsigned i = 0; i < kv.first->length(); i++) {
      bool copyCurr = true;
      for (const auto& lit : kv.second) {
        TermReplacement tr(getContextReplacementMap(context, /*inverse=*/true));
        auto rlit = tr.transformLiteral(lit);
        if (rlit == (*kv.first)[i]) {
          copyCurr = false;
          break;
        }
      }
      if (copyCurr) {
        Literal* l = (*kv.first)[i];
        if (indLitSubst) {
          l = SubstHelper::apply<Substitution>((*kv.first)[i], *indLitSubst);
          TermReplacement tr(getContextReplacementMap(context, /*inverse=*/true));
          l = tr.transformLiteral(l);
        }
        resLits->push(renaming.apply(l,1));
      }
    }
  }

  return Clause::fromStack(*resLits, inf);
}